

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<VkSpecParser::TypedName>::relocate
          (QArrayDataPointer<VkSpecParser::TypedName> *this,qsizetype offset,TypedName **data)

{
  TypedName *d_first;
  TypedName *pTVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<VkSpecParser::TypedName,long_long>(this->ptr,this->size,d_first);
  if (data != (TypedName **)0x0) {
    pTVar1 = *data;
    if ((this->ptr <= pTVar1) && (pTVar1 < this->ptr + this->size)) {
      *data = pTVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }